

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::resetActiveWindow(QMdiAreaPrivate *this,QMdiSubWindow *deactivatedWindow)

{
  long lVar1;
  bool bVar2;
  QMdiArea *this_00;
  QWidget *this_01;
  QWidget *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiArea *q;
  QMdiAreaPrivate *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = q_func(in_RDI);
  if (in_RSI == (QWidget *)0x0) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x60e9ed);
    if (!bVar2) {
      QPointer<QMdiSubWindow>::operator=((QPointer<QMdiSubWindow> *)this_00,(QMdiSubWindow *)in_RDI)
      ;
      QMdiArea::subWindowActivated((QMdiArea *)0x60ea17,(QMdiSubWindow *)in_RDI);
    }
  }
  else {
    bVar2 = ::operator!=((QMdiSubWindow **)this_00,(QPointer<QMdiSubWindow> *)in_RDI);
    if (!bVar2) {
      QPointer<QMdiSubWindow>::operator=((QPointer<QMdiSubWindow> *)this_00,(QMdiSubWindow *)in_RDI)
      ;
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x60e983);
      if ((((bVar2) || ((in_RDI->isActivated & 1U) != 0)) ||
          (bVar2 = lastWindowAboutToBeDestroyed(this_02), bVar2)) &&
         (bVar2 = isExplicitlyDeactivated(in_RDI,(QMdiSubWindow *)0x60e9b1), !bVar2)) {
        this_01 = QWidget::window(in_RSI);
        bVar2 = QWidget::isMinimized(this_01);
        if (!bVar2) goto LAB_0060ea17;
      }
      QMdiArea::subWindowActivated((QMdiArea *)0x60e9db,(QMdiSubWindow *)in_RDI);
    }
  }
LAB_0060ea17:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::resetActiveWindow(QMdiSubWindow *deactivatedWindow)
{
    Q_Q(QMdiArea);
    if (deactivatedWindow) {
        if (deactivatedWindow != active)
            return;
        active = nullptr;
        if ((aboutToBecomeActive || isActivated || lastWindowAboutToBeDestroyed())
            && !isExplicitlyDeactivated(deactivatedWindow) && !q->window()->isMinimized()) {
            return;
        }
        emit q->subWindowActivated(nullptr);
        return;
    }

    if (aboutToBecomeActive)
        return;

    active = nullptr;
    emit q->subWindowActivated(nullptr);
}